

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O0

void ssh1_login_setup_tis_scc(ssh1_login_state *s)

{
  StripCtrlChars *pSVar1;
  ssh1_login_state *s_local;
  
  if ((s->tis_scc_initialised & 1U) == 0) {
    pSVar1 = seat_stripctrl_new((s->ppl).seat,(BinarySink *)0x0,SIC_KI_PROMPTS);
    s->tis_scc = pSVar1;
    if (s->tis_scc != (StripCtrlChars *)0x0) {
      stripctrl_enable_line_limiting(s->tis_scc);
    }
    s->tis_scc_initialised = true;
  }
  return;
}

Assistant:

static void ssh1_login_setup_tis_scc(struct ssh1_login_state *s)
{
    if (s->tis_scc_initialised)
        return;
    s->tis_scc = seat_stripctrl_new(s->ppl.seat, NULL, SIC_KI_PROMPTS);
    if (s->tis_scc)
        stripctrl_enable_line_limiting(s->tis_scc);
    s->tis_scc_initialised = true;
}